

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O1

void __thiscall RawDataHandleStorage::RawDataHandleStorage(RawDataHandleStorage *this,FILE *f)

{
  size_t __size;
  void *pvVar1;
  
  (this->super_RefCountedStorage).refCount = 1;
  (this->super_RefCountedStorage)._vptr_RefCountedStorage =
       (_func_int **)&PTR__RawDataHandleStorage_001d1568;
  fseek((FILE *)f,0,2);
  __size = ftell((FILE *)f);
  this->dataSize = __size;
  pvVar1 = malloc(__size);
  this->data = pvVar1;
  if (pvVar1 != (void *)0x0) {
    fseek((FILE *)f,0,0);
    fread(this->data,1,this->dataSize,(FILE *)f);
    return;
  }
  return;
}

Assistant:

RawDataHandleStorage(FILE *f) {
		fseek(f, 0, SEEK_END);
		dataSize = ftell(f);
		data = malloc(dataSize);
		if (data) {
			fseek(f, 0, SEEK_SET);
			fread(data, 1, dataSize, f);
		}
	}